

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void allocate_gradient_info_for_hog(AV1_COMP *cpi)

{
  _Bool _Var1;
  long in_RDI;
  int plane_types;
  AV1_COMMON *cm;
  PixelLevelGradientInfo *pixel_gradient_info;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  void *local_10;
  
  _Var1 = is_gradient_caching_for_hog_enabled
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (_Var1) {
    local_10 = *(void **)(in_RDI + 0x3be70);
    if (local_10 == (void *)0x0) {
      local_10 = aom_malloc(0x22ebe2);
      if (local_10 == (void *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pixel_gradient_info");
      }
      *(void **)(in_RDI + 0x3be70) = local_10;
    }
    *(void **)(in_RDI + 0x346e8) = local_10;
  }
  return;
}

Assistant:

static inline void allocate_gradient_info_for_hog(AV1_COMP *cpi) {
  if (!is_gradient_caching_for_hog_enabled(cpi)) return;

  PixelLevelGradientInfo *pixel_gradient_info = cpi->td.pixel_gradient_info;
  if (!pixel_gradient_info) {
    const AV1_COMMON *const cm = &cpi->common;
    const int plane_types = PLANE_TYPES >> cm->seq_params->monochrome;
    CHECK_MEM_ERROR(
        cm, pixel_gradient_info,
        aom_malloc(sizeof(*pixel_gradient_info) * plane_types * MAX_SB_SQUARE));
    cpi->td.pixel_gradient_info = pixel_gradient_info;
  }

  cpi->td.mb.pixel_gradient_info = pixel_gradient_info;
}